

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void discharge2reg(FuncState *fs,expdesc *e,int reg)

{
  lua_Number n;
  Instruction *pIVar1;
  int iVar2;
  Instruction i;
  Value local_28;
  byte local_20;
  
  luaK_dischargevars(fs,e);
  switch(e->k) {
  case VNIL:
    luaK_nil(fs,reg,1);
    break;
  case VTRUE:
    i = reg << 7 | 7;
    goto LAB_0010edf4;
  case VFALSE:
    i = reg << 7 | 5;
LAB_0010edf4:
    luaK_code(fs,i);
    break;
  case VK:
    goto switchD_0010ed71_caseD_4;
  case VKFLT:
    n = (e->u).nval;
    iVar2 = luaV_flttointeger(n,&local_28.i,F2Ieq);
    if ((iVar2 != 0) && ((code *)0xfffffffffffdffff < local_28.f + -0x10001)) {
      i = (int)local_28.i * 0x8000 + 0x7fff8000U | reg << 7 | 2;
      goto LAB_0010edf4;
    }
    iVar2 = luaK_numberK(fs,n);
    goto LAB_0010ee3f;
  case VKINT:
    luaK_int(fs,reg,(e->u).ival);
    break;
  case VKSTR:
    local_28 = (Value)(e->u).strval;
    local_20 = (local_28.gc)->tt | 0x40;
    iVar2 = addk(fs,(TValue *)&local_28,(TValue *)&local_28);
    (e->u).info = iVar2;
    e->k = VK;
    goto switchD_0010ed71_caseD_4;
  case VNONRELOC:
    if ((e->u).info != reg) {
      i = (e->u).info << 0x10 | reg << 7;
      goto LAB_0010edf4;
    }
    break;
  default:
    goto switchD_0010ed71_caseD_9;
  case VRELOC:
    pIVar1 = fs->f->code;
    pIVar1[(e->u).info] = (reg & 0xffU) << 7 | pIVar1[(e->u).info] & 0xffff807f;
  }
LAB_0010ee65:
  (e->u).info = reg;
  e->k = VNONRELOC;
switchD_0010ed71_caseD_9:
  return;
switchD_0010ed71_caseD_4:
  iVar2 = (e->u).info;
LAB_0010ee3f:
  luaK_codek(fs,reg,iVar2);
  goto LAB_0010ee65;
}

Assistant:

static void discharge2reg (FuncState *fs, expdesc *e, int reg) {
  luaK_dischargevars(fs, e);
  switch (e->k) {
    case VNIL: {
      luaK_nil(fs, reg, 1);
      break;
    }
    case VFALSE: {
      luaK_codeABC(fs, OP_LOADFALSE, reg, 0, 0);
      break;
    }
    case VTRUE: {
      luaK_codeABC(fs, OP_LOADTRUE, reg, 0, 0);
      break;
    }
    case VKSTR: {
      str2K(fs, e);
    }  /* FALLTHROUGH */
    case VK: {
      luaK_codek(fs, reg, e->u.info);
      break;
    }
    case VKFLT: {
      luaK_float(fs, reg, e->u.nval);
      break;
    }
    case VKINT: {
      luaK_int(fs, reg, e->u.ival);
      break;
    }
    case VRELOC: {
      Instruction *pc = &getinstruction(fs, e);
      SETARG_A(*pc, reg);  /* instruction will put result in 'reg' */
      break;
    }
    case VNONRELOC: {
      if (reg != e->u.info)
        luaK_codeABC(fs, OP_MOVE, reg, e->u.info, 0);
      break;
    }
    default: {
      lua_assert(e->k == VJMP);
      return;  /* nothing to do... */
    }
  }
  e->u.info = reg;
  e->k = VNONRELOC;
}